

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_private.h
# Opt level: O3

char * ERR_getErrorName(size_t code)

{
  uint uVar1;
  
  uVar1 = 0;
  if (0xfffffffffffffff7 < code) {
    uVar1 = -(int)code;
  }
  if (uVar1 < 9) {
    return &DAT_001b3928 + *(int *)(&DAT_001b3928 + (ulong)uVar1 * 4);
  }
  return "Unspecified error code";
}

Assistant:

ERR_STATIC const char* ERR_getErrorName(size_t code)
{
    return ERR_getErrorString(ERR_getErrorCode(code));
}